

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.hpp
# Opt level: O0

bool __thiscall
rek::Solver::hasConverged
          (Solver *this,SparseMatrix<double,_1,_int> *A,SparseMatrix<double,_0,_int> *AColMajor,
          RowVector *x,RowVector *b,RowVector *z,double tolerance)

{
  RealScalar RVar1;
  non_const_type local_100;
  Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>
  local_f8;
  undefined1 local_e8 [8];
  RowVector zA;
  undefined1 auStack_c0 [7];
  bool condOne;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_90;
  undefined1 local_58 [8];
  RowVector residual;
  double tolerance_local;
  RowVector *z_local;
  RowVector *b_local;
  RowVector *x_local;
  SparseMatrix<double,_0,_int> *AColMajor_local;
  SparseMatrix<double,_1,_int> *A_local;
  Solver *this_local;
  
  residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       (Index)tolerance;
  _auStack_c0 = Eigen::SparseMatrixBase<Eigen::SparseMatrix<double,1,int>>::operator*
                          ((SparseMatrixBase<Eigen::SparseMatrix<double,1,int>> *)A,
                           (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)x);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>>
  ::operator-(&local_b0,
              (MatrixBase<Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
               *)auStack_c0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)b);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
  ::operator+(&local_90,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
               *)&local_b0,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::SparseMatrix<double,1,int>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
            ((Matrix<double,_1,1,0,_1,1> *)local_58,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::SparseMatrix<double,_1,_int>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_90);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_58);
  if (RVar1 < (double)residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                      m_storage.m_rows) {
    local_100 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)z);
    local_f8 = Eigen::operator*((MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                 *)&local_100,
                                (SparseMatrixBase<Eigen::SparseMatrix<double,_0,_int>_> *)AColMajor)
    ;
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,1,0,_1,1>const>,Eigen::SparseMatrix<double,0,int>,0>>
              ((Matrix<double,_1,1,0,_1,1> *)local_e8,
               (EigenBase<Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::SparseMatrix<double,_0,_int>,_0>_>
                *)&local_f8);
    RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::norm
                      ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_e8);
    this_local._7_1_ =
         RVar1 < (double)residual.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                         m_storage.m_rows;
    zA.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 1;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_e8);
  }
  else {
    this_local._7_1_ = false;
    zA.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._0_4_ = 1;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_58);
  return this_local._7_1_;
}

Assistant:

bool hasConverged(SparseMatrix<double, RowMajor> &A,
                    SparseMatrix<double, ColMajor> &AColMajor,
                    const RowVector &x, const RowVector &b, const RowVector &z,
                    double tolerance) const {
    const RowVector residual = A * x - b + z;
    const bool condOne = residual.norm() < tolerance;

    // Early return
    if (!condOne) return false;

    const RowVector zA = z.transpose() * AColMajor;
    return zA.norm() < tolerance;
  }